

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O2

Move * cuddZddSymmSifting_up(DdManager *table,int x,int x_low,int initial_size)

{
  DdHalfWord x_00;
  DdSubtable *pDVar1;
  DdHalfWord DVar2;
  int iVar3;
  DdHalfWord DVar4;
  DdNode *pDVar5;
  DdNode *local_48;
  int local_3c;
  double local_38;
  
  local_48 = (DdNode *)0x0;
  local_3c = x_low;
  DVar2 = cuddZddNextLow(table,x);
  do {
    if ((int)DVar2 < local_3c) {
      return (Move *)local_48;
    }
    x_00 = table->subtableZ[(int)DVar2].next;
    iVar3 = cuddZddSymmCheck(table,DVar2,x);
    pDVar1 = table->subtableZ;
    if (iVar3 == 0) {
      local_38 = (double)initial_size;
      if ((pDVar1[x].next == x) && (pDVar1[(int)DVar2].next == DVar2)) {
        iVar3 = cuddZddSwapInPlace(table,DVar2,x);
        if ((iVar3 == 0) || (pDVar5 = cuddDynamicAllocNode(table), pDVar5 == (DdNode *)0x0)) {
          while (local_48 != (DdNode *)0x0) {
            pDVar5 = (local_48->type).kids.T;
            local_48->ref = 0;
            local_48->next = table->nextFree;
            table->nextFree = local_48;
            local_48 = pDVar5;
          }
          return (Move *)0x1;
        }
        pDVar5->index = DVar2;
        pDVar5->ref = x;
        *(int *)((long)&pDVar5->next + 4) = iVar3;
        (pDVar5->type).kids.T = local_48;
        if (local_38 * table->maxGrowth < (double)iVar3) {
          return (Move *)pDVar5;
        }
        local_48 = pDVar5;
        if (iVar3 < initial_size) {
          initial_size = iVar3;
        }
      }
      else {
        iVar3 = zdd_group_move(table,DVar2,x,(Move **)&local_48);
        if (local_38 * table->maxGrowth < (double)iVar3) {
          return (Move *)local_48;
        }
        if (iVar3 < initial_size) {
          initial_size = iVar3;
        }
      }
    }
    else {
      pDVar1[(int)DVar2].next = x;
      DVar2 = pDVar1[x].next;
      do {
        DVar4 = DVar2;
        DVar2 = pDVar1[(int)DVar4].next;
      } while (pDVar1[(int)DVar4].next != x);
      pDVar1[(int)DVar4].next = x_00;
    }
    DVar2 = cuddZddNextLow(table,x_00);
    x = x_00;
  } while( true );
}

Assistant:

static Move *
cuddZddSymmSifting_up(
  DdManager * table,
  int  x,
  int  x_low,
  int  initial_size)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size;
    int         limit_size = initial_size;
    int         i, gytop;

    moves = NULL;
    y = cuddZddNextLow(table, x);
    while (y >= x_low) {
        gytop = table->subtableZ[y].next;
        if (cuddZddSymmCheck(table, y, x)) {
            /* Symmetry found, attach symm groups */
            table->subtableZ[y].next = x;
            i = table->subtableZ[x].next;
            while (table->subtableZ[i].next != (unsigned) x)
                i = table->subtableZ[i].next;
            table->subtableZ[i].next = gytop;
        }
        else if ((table->subtableZ[x].next == (unsigned) x) &&
            (table->subtableZ[y].next == (unsigned) y)) {
            /* x and y have self symmetry */
            size = cuddZddSwapInPlace(table, y, x);
            if (size == 0)
                goto cuddZddSymmSifting_upOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL)
                goto cuddZddSymmSifting_upOutOfMem;
            move->x = y;
            move->y = x;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double)size >
                (double)limit_size * table->maxGrowth)
                return(moves);
            if (size < limit_size)
                limit_size = size;
        }
        else { /* Group move */
            size = zdd_group_move(table, y, x, &moves);
            if ((double)size >
                (double)limit_size * table->maxGrowth)
                return(moves);
            if (size < limit_size)
                limit_size = size;
        }
        x = gytop;
        y = cuddZddNextLow(table, x);
    }

    return(moves);

cuddZddSymmSifting_upOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(ZDD_MV_OOM);

}